

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void wal_delete_compact_upto_test(void)

{
  fdb_status fVar1;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  size_t valuelen;
  void *value;
  char keybuf [256];
  fdb_kvs_info kvs_info;
  uint64_t num_markers;
  fdb_status status;
  fdb_snapshot_info_t *markers;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  uint64_t *in_stack_00000e38;
  fdb_snapshot_info_t **in_stack_00000e40;
  fdb_file_handle *in_stack_00000e48;
  fdb_kvs_handle *in_stack_fffffffffffffcd8;
  fdb_file_handle *in_stack_fffffffffffffce0;
  fdb_kvs_handle *markers_00;
  fdb_kvs_handle *in_stack_fffffffffffffcf8;
  void **in_stack_fffffffffffffd00;
  fdb_kvs_handle *in_stack_fffffffffffffd08;
  undefined1 *in_stack_fffffffffffffd10;
  fdb_kvs_handle *in_stack_fffffffffffffd18;
  fdb_kvs_info *in_stack_fffffffffffffe40;
  fdb_kvs_handle *in_stack_fffffffffffffe48;
  fdb_config *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  fdb_file_handle **in_stack_ffffffffffffff08;
  fdb_kvs_handle *local_68;
  uint local_54;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fdb_open(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  fdb_kvs_open_default
            (in_stack_fffffffffffffce0,(fdb_kvs_handle **)in_stack_fffffffffffffcd8,
             (fdb_kvs_config *)0x1129fb);
  local_54 = 0;
  do {
    if (9 < (int)local_54) {
      fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffcd8,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xa66);
        wal_delete_compact_upto_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xa66,"void wal_delete_compact_upto_test()");
        }
      }
      do {
        if (0x13 < (int)local_54) {
          local_54 = 0xf;
          do {
            if (0x13 < (int)local_54) {
              fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffcd8,'\0');
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xa77);
                wal_delete_compact_upto_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                ,0xa77,"void wal_delete_compact_upto_test()");
                }
              }
              sprintf(&stack0xfffffffffffffe48,"key%d",(ulong)local_54);
              markers_00 = local_68;
              strlen(&stack0xfffffffffffffe48);
              fVar1 = fdb_set_kv(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                                 (size_t)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                                 (size_t)in_stack_fffffffffffffcf8);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xa7d);
                wal_delete_compact_upto_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                ,0xa7d,"void wal_delete_compact_upto_test()");
                }
              }
              fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffcd8,'\0');
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xa7f);
                wal_delete_compact_upto_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                ,0xa7f,"void wal_delete_compact_upto_test()");
                }
              }
              fVar1 = fdb_get_all_snap_markers
                                (in_stack_00000e48,in_stack_00000e40,in_stack_00000e38);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xa84);
                wal_delete_compact_upto_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                ,0xa84,"void wal_delete_compact_upto_test()");
                }
              }
              fVar1 = fdb_compact_upto(in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8,
                                       0x112fce);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xa88);
                wal_delete_compact_upto_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                ,0xa88,"void wal_delete_compact_upto_test()");
                }
              }
              fVar1 = fdb_free_snap_markers
                                ((fdb_snapshot_info_t *)markers_00,
                                 (uint64_t)in_stack_fffffffffffffce0);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xa8a);
                wal_delete_compact_upto_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                ,0xa8a,"void wal_delete_compact_upto_test()");
                }
              }
              fVar1 = fdb_get_kvs_info(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xa8d);
                wal_delete_compact_upto_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                ,0xa8d,"void wal_delete_compact_upto_test()");
                }
              }
              local_54 = 0xf;
              do {
                if (0x13 < (int)local_54) {
                  fdb_kvs_close(in_stack_fffffffffffffcd8);
                  fdb_close((fdb_file_handle *)in_stack_fffffffffffffcd8);
                  fdb_shutdown();
                  memleak_end();
                  if (wal_delete_compact_upto_test::__test_pass == 0) {
                    fprintf(_stderr,"%s FAILED\n","compact upto with wal deletes test");
                  }
                  else {
                    fprintf(_stderr,"%s PASSED\n","compact upto with wal deletes test");
                  }
                  return;
                }
                sprintf(&stack0xfffffffffffffe48,"key%d",(ulong)local_54);
                in_stack_fffffffffffffcd8 = local_68;
                strlen(&stack0xfffffffffffffe48);
                fVar1 = fdb_get_kv(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                                   (size_t)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                                   (size_t *)in_stack_fffffffffffffcf8);
                if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xa93);
                  wal_delete_compact_upto_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
                    __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                  ,0xa93,"void wal_delete_compact_upto_test()");
                  }
                }
                local_54 = local_54 + 1;
              } while( true );
            }
            sprintf(&stack0xfffffffffffffe48,"key%d",(ulong)local_54);
            in_stack_fffffffffffffd00 = (void **)&stack0xfffffffffffffe48;
            in_stack_fffffffffffffcf8 = local_68;
            strlen(&stack0xfffffffffffffe48);
            fVar1 = fdb_del_kv(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                               (size_t)in_stack_fffffffffffffcf8);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xa73);
              wal_delete_compact_upto_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                              ,0xa73,"void wal_delete_compact_upto_test()");
              }
            }
            local_54 = local_54 + 1;
          } while( true );
        }
        sprintf(&stack0xfffffffffffffe48,"key%d",(ulong)local_54);
        in_stack_fffffffffffffd10 = &stack0xfffffffffffffe48;
        in_stack_fffffffffffffd08 = local_68;
        strlen(&stack0xfffffffffffffe48);
        fVar1 = fdb_set_kv(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                           (size_t)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                           (size_t)in_stack_fffffffffffffcf8);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xa6d);
          wal_delete_compact_upto_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xa6d,"void wal_delete_compact_upto_test()");
          }
        }
        local_54 = local_54 + 1;
      } while( true );
    }
    sprintf(&stack0xfffffffffffffe48,"key%d",(ulong)local_54);
    in_stack_fffffffffffffd18 = local_68;
    strlen(&stack0xfffffffffffffe48);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                       (size_t)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                       (size_t)in_stack_fffffffffffffcf8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xa62);
      wal_delete_compact_upto_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xa62,"void wal_delete_compact_upto_test()");
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void wal_delete_compact_upto_test()
{
    TEST_INIT();
    memleak_start();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_snapshot_info_t *markers;
    fdb_status status;
    uint64_t num_markers;
    fdb_kvs_info kvs_info;
    char keybuf[256];
    void *value;
    size_t valuelen;

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 19;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // open db
    fdb_open(&dbfile, "./compact_test5", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // insert a few keys...
    for (i=0;i<10;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert keys such that last insert causes wal flush...
    for (; i<20;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // Now delete half of the newly inserted keys
    for (i = 15; i < 20; ++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_del_kv(db, keybuf, strlen(keybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // Now deleted items are in the unflushed wal..
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another header for compact_upto()
    sprintf(keybuf, "key%d", i);
    status = fdb_set_kv(db, keybuf, strlen(keybuf),
            (void*)"value", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Get all snap markers..
    status = fdb_get_all_snap_markers(dbfile, &markers,
                                      &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // compact upto the delete wal's marker...
    status = fdb_compact_upto(dbfile, NULL, markers[1].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Deleted items should not be found..
    for (i = 15; i < 20; ++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("compact upto with wal deletes test");
}